

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

int ON_Intersect(ON_Plane *plane,ON_Sphere *sphere,ON_Circle *circle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint p;
  bool bVar4;
  long lVar5;
  int iVar6;
  ON_Circle *pOVar7;
  byte bVar8;
  ON_3dPoint circle_center;
  ON_3dPoint C1;
  ON_3dPoint sphere_center;
  ON_3dVector R;
  ON_3dPoint local_c8;
  double local_a8;
  undefined8 uStack_a0;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  bVar8 = 0;
  local_a8 = sphere->radius;
  uStack_a0 = 0;
  dVar3 = ABS(local_a8);
  ON_Sphere::Center(sphere);
  p.y = local_78.y;
  p.x = local_78.x;
  p.z = local_78.z;
  ON_Plane::ClosestPointTo(&local_c8,plane,p);
  dVar1 = ON_3dPoint::DistanceTo(&local_c8,&local_78);
  circle->radius = 0.0;
  bVar4 = ON_IsValid(dVar3);
  iVar6 = 0;
  if (bVar4) {
    bVar4 = ON_IsValid(dVar1);
    iVar6 = 0;
    if (bVar4) {
      dVar2 = dVar3 * 1.490116119385e-08;
      if (dVar2 <= 2.3283064365386963e-10) {
        dVar2 = 2.3283064365386963e-10;
      }
      if (dVar1 <= dVar2 + dVar3) {
        if ((local_a8 != 0.0) &&
           (dVar1 = 1.0 - (dVar1 / dVar3) * (dVar1 / dVar3), 8.881784197001252e-16 < dVar1)) {
          if (dVar1 < 0.0) {
            dVar1 = sqrt(dVar1);
          }
          else {
            dVar1 = SQRT(dVar1);
          }
          circle->radius = dVar1 * dVar3;
          iVar6 = 2;
          if (2.3283064365386963e-10 < dVar1 * dVar3) goto LAB_004b87d1;
        }
        circle->radius = 0.0;
        ON_3dPoint::operator-(&local_60,&local_c8,&local_78);
        dVar1 = ON_3dVector::Length(&local_60);
        if (0.0 < dVar1) {
          ON_3dVector::Unitize(&local_60);
          operator*(&local_48,dVar3,&local_60);
          ON_3dPoint::operator+(&local_90,&local_78,&local_48);
          dVar3 = ON_3dPoint::DistanceTo(&local_90,&local_78);
          if (ABS(sphere->radius - dVar3) < ABS(sphere->radius - dVar1)) {
            local_c8.z = local_90.z;
            local_c8.x = local_90.x;
            local_c8.y = local_90.y;
          }
        }
        iVar6 = 1;
      }
    }
  }
LAB_004b87d1:
  pOVar7 = circle;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->plane).origin.x = (plane->origin).x;
    plane = (ON_Plane *)((long)plane + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Circle *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  (circle->plane).origin.z = local_c8.z;
  (circle->plane).origin.x = local_c8.x;
  (circle->plane).origin.y = local_c8.y;
  ON_Plane::UpdateEquation(&circle->plane);
  return iVar6;
}

Assistant:

int ON_Intersect(
        const ON_Plane& plane,
        const ON_Sphere& sphere, 
        ON_Circle& circle
        )
{
  // 16 April 2011 Dale Lear
  //   Prior to this date, this function did not return the correct answer.

  int rc = 0;
  const double sphere_radius = fabs(sphere.radius);
  double tol = sphere_radius*ON_SQRT_EPSILON;
  if ( !(tol >= ON_ZERO_TOLERANCE) )
    tol = ON_ZERO_TOLERANCE;
  const ON_3dPoint sphere_center = sphere.Center();
  ON_3dPoint circle_center = plane.ClosestPointTo(sphere_center);
  double d = circle_center.DistanceTo(sphere_center);

  circle.radius = 0.0;

  if ( ON_IsValid(sphere_radius) && ON_IsValid(d) && d <= sphere_radius + tol )
  {
    if ( sphere_radius > 0.0 )
    {
      d /= sphere_radius;
      d = 1.0 - d*d;
      // The d > 4.0*ON_EPSILON was picked by testing spheres with
      // radius = 1 and center = (0,0,0).  Do not make 4.0*ON_EPSILON 
      // any smaller and please discuss changes with Dale Lear.
      circle.radius = (d > 4.0*ON_EPSILON) ? sphere_radius*sqrt(d) : 0.0;
    }
    else
      circle.radius = 0.0;

    if ( circle.radius <= ON_ZERO_TOLERANCE )
    {
      // return a single point
      rc = 1;
      
      circle.radius = 0.0;

      //  When tolerance is in play, put the point on the sphere.
      //  If the caller prefers the plane, then they can adjust the
      //  returned answer to get the plane.
      ON_3dVector R = circle_center - sphere_center;
      double r0 = R.Length();
      if ( r0 > 0.0 )
      {
        R.Unitize();
        ON_3dPoint C1 = sphere_center + sphere_radius*R;
        double r1 = C1.DistanceTo(sphere_center);
        if ( fabs(sphere.radius-r1) < fabs(sphere.radius-r0) )
          circle_center = C1;
      }
    }
    else 
    {
      // return a circle
      rc = 2;
    }
  }

  // Update circle's plane here in case the input plane 
  // is the circle's plane member.
  circle.plane = plane;
  circle.plane.origin = circle_center;
  circle.plane.UpdateEquation();

  return rc;
}